

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dynamic_message.cc
# Opt level: O0

Message * __thiscall
google::protobuf::DynamicMessageFactory::GetPrototype(DynamicMessageFactory *this,Descriptor *type)

{
  LogMessage *pLVar1;
  Message *pMVar2;
  MutexLock local_50;
  MutexLock lock;
  LogMessage local_30;
  Voidify local_19;
  Descriptor *local_18;
  Descriptor *type_local;
  DynamicMessageFactory *this_local;
  
  local_18 = type;
  type_local = (Descriptor *)this;
  if (type != (Descriptor *)0x0) {
    absl::lts_20250127::MutexLock::MutexLock(&local_50,&this->prototypes_mutex_);
    pMVar2 = GetPrototypeNoLock(this,local_18);
    absl::lts_20250127::MutexLock::~MutexLock(&local_50);
    return pMVar2;
  }
  absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
            ((LogMessageFatal *)&local_30,
             "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/dynamic_message.cc"
             ,0x303,"type != nullptr");
  pLVar1 = absl::lts_20250127::log_internal::LogMessage::InternalStream(&local_30);
  absl::lts_20250127::log_internal::Voidify::operator&&(&local_19,pLVar1);
  absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
}

Assistant:

const Message* PROTOBUF_NONNULL
DynamicMessageFactory::GetPrototype(const Descriptor* PROTOBUF_NONNULL type) {
  ABSL_CHECK(type != nullptr);
  absl::MutexLock lock(&prototypes_mutex_);
  return GetPrototypeNoLock(type);
}